

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_0::TestChild::TestChild(TestChild *this,UnixEventPort *port,int exitCode)

{
  int osErrorNumber;
  void *pvVar1;
  undefined1 local_d8 [24];
  sigset_t sigs;
  Fault f;
  SyscallResult local_34;
  undefined1 local_30 [4];
  SyscallResult _kjSyscallResult;
  pid_t p;
  int exitCode_local;
  UnixEventPort *port_local;
  TestChild *this_local;
  
  Maybe<int>::Maybe(&this->pid);
  Promise<int>::Promise(&this->promise,(void *)0x0);
  f.exception = (Exception *)local_30;
  local_34 = _::Debug::
             syscall<kj::(anonymous_namespace)::TestChild::TestChild(kj::UnixEventPort&,int)::_lambda()_1_>
                       ((anon_class_8_1_54a39810 *)&f,false);
  pvVar1 = _::Debug::SyscallResult::operator_cast_to_void_(&local_34);
  if (pvVar1 == (void *)0x0) {
    osErrorNumber = _::Debug::SyscallResult::getErrorNumber(&local_34);
    _::Debug::Fault::Fault
              ((Fault *)(sigs.__val + 0xf),
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x2be,osErrorNumber,"p = fork()","");
    _::Debug::Fault::fatal((Fault *)(sigs.__val + 0xf));
  }
  if (local_30 == (undefined1  [4])0x0) {
    (anonymous_namespace)::exitCodeForSignal = exitCode;
    signal(0xf,exitSignalHandler);
    sigemptyset((sigset_t *)(local_d8 + 0x10));
    sigaddset((sigset_t *)(local_d8 + 0x10),0xf);
    sigprocmask(1,(sigset_t *)(local_d8 + 0x10),(sigset_t *)0x0);
    do {
      pause();
    } while( true );
  }
  Maybe<int>::operator=(&this->pid,(int *)local_30);
  UnixEventPort::onChildExit((UnixEventPort *)local_d8,(Maybe<int> *)port);
  Promise<int>::operator=(&this->promise,(Promise<int> *)local_d8);
  Promise<int>::~Promise((Promise<int> *)local_d8);
  return;
}

Assistant:

TestChild(UnixEventPort& port, int exitCode) {
    pid_t p;
    KJ_SYSCALL(p = fork());
    if (p == 0) {
      // Arrange for SIGTERM to cause the process to exit normally.
      exitCodeForSignal = exitCode;
      signal(SIGTERM, &exitSignalHandler);
      sigset_t sigs;
      sigemptyset(&sigs);
      sigaddset(&sigs, SIGTERM);
      sigprocmask(SIG_UNBLOCK, &sigs, nullptr);

      for (;;) pause();
    }
    pid = p;
    promise = port.onChildExit(pid);
  }